

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManEquivSetColor_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int fOdds)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int fOdds_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjId(p,pObj);
  iVar1 = Gia_ObjVisitColor(p,iVar1,fOdds);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsRo(p,pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                      ,0x2a4,"int Gia_ManEquivSetColor_rec(Gia_Man_t *, Gia_Obj_t *, int)");
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      iVar1 = Gia_ManEquivSetColor_rec(p,pGVar3,fOdds);
      pGVar3 = Gia_ObjFanin1(pObj);
      iVar2 = Gia_ManEquivSetColor_rec(p,pGVar3,fOdds);
      p_local._4_4_ = iVar1 + 1 + iVar2;
    }
    else {
      pGVar3 = Gia_ObjRoToRi(p,pObj);
      pGVar3 = Gia_ObjFanin0(pGVar3);
      iVar1 = Gia_ManEquivSetColor_rec(p,pGVar3,fOdds);
      p_local._4_4_ = iVar1 + 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManEquivSetColor_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fOdds )
{
    if ( Gia_ObjVisitColor( p, Gia_ObjId(p,pObj), fOdds ) )
        return 0;
    if ( Gia_ObjIsRo(p, pObj) )
        return 1 + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj)), fOdds );
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(pObj), fOdds )
             + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin1(pObj), fOdds );
}